

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O2

void mcpl_dump_particles(mcpl_file_t f,uint64_t nskip,uint64_t nlimit,
                        _func_int_mcpl_particle_t_ptr *filter)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  mcpl_particle_t *pmVar5;
  uint64_t count;
  uint64_t uVar6;
  mcpl_fileinternal_t *f_1;
  bool bVar7;
  
  iVar2 = *(int *)((long)f.internal + 0x1c);
  iVar3 = *(int *)((long)f.internal + 0x20);
  dVar1 = *(double *)((long)f.internal + 0x30);
  printf(
        "index     pdgcode   ekin[MeV]       x[cm]       y[cm]       z[cm]          ux          uy          uz    time[ms]"
        );
  if ((dVar1 == 0.0) && (!NAN(dVar1))) {
    printf("      weight");
  }
  if (iVar3 != 0) {
    printf("       pol-x       pol-y       pol-z");
  }
  if (iVar2 != 0) {
    printf("  userflags");
  }
  putchar(10);
  mcpl_skipforward(f,nskip);
  uVar6 = nlimit;
  while ((nlimit == 0 || (bVar7 = uVar6 != 0, uVar6 = uVar6 - 1, bVar7))) {
    pmVar5 = mcpl_read(f);
    if (pmVar5 == (mcpl_particle_t *)0x0) {
      return;
    }
    if ((filter == (_func_int_mcpl_particle_t_ptr *)0x0) || (iVar4 = (*filter)(pmVar5), iVar4 != 0))
    {
      printf("%5lu %11i %11.5g %11.5g %11.5g %11.5g %11.5g %11.5g %11.5g %11.5g",pmVar5->ekin,
             pmVar5->position[0],pmVar5->position[1],pmVar5->position[2],pmVar5->direction[0],
             pmVar5->direction[1],pmVar5->direction[2],pmVar5->time,
             *(long *)((long)f.internal + 0x88) + -1,(ulong)(uint)pmVar5->pdgcode);
      if ((dVar1 == 0.0) && (!NAN(dVar1))) {
        printf(" %11.5g",pmVar5->weight);
      }
      if (iVar3 != 0) {
        printf(" %11.5g %11.5g %11.5g",pmVar5->polarisation[0],pmVar5->polarisation[1],
               pmVar5->polarisation[2]);
      }
      if (iVar2 != 0) {
        printf(" 0x%08x",(ulong)pmVar5->userflags);
      }
      putchar(10);
    }
    else {
      uVar6 = uVar6 + 1;
    }
  }
  return;
}

Assistant:

void mcpl_dump_particles(mcpl_file_t f, uint64_t nskip, uint64_t nlimit,
                         int(filter)(const mcpl_particle_t*))
{
  int has_uf = mcpl_hdr_has_userflags(f);
  int has_pol = mcpl_hdr_has_polarisation(f);
  double uweight = mcpl_hdr_universal_weight(f);
  printf("index     pdgcode   ekin[MeV]       x[cm]       y[cm]       z[cm]          ux          uy          uz    time[ms]");
  if (!uweight)
    printf("      weight");
  if (has_pol)
    printf("       pol-x       pol-y       pol-z");
  if (has_uf)
    printf("  userflags");
  printf("\n");
  mcpl_skipforward(f,nskip);
  //Writing the next loop in an annoying way to silence MSVC C4706 warning:
  for ( uint64_t count = nlimit ; ( nlimit==0 || count-- ) ; ) {
    const mcpl_particle_t* p = mcpl_read(f);
    if (!p)
      break;
    if (filter && !filter(p) ) {
      ++count;
      continue;
    }
    uint64_t idx = mcpl_currentposition(f)-1;//-1 since mcpl_read skipped ahead
    printf( "%5" PRIu64
            " %11i %11.5g %11.5g %11.5g %11.5g %11.5g %11.5g %11.5g %11.5g",
            idx, p->pdgcode, p->ekin,
            p->position[0], p->position[1], p->position[2],
            p->direction[0], p->direction[1], p->direction[2],
            p->time );
    if (!uweight)
      printf(" %11.5g",p->weight);
    if (has_pol)
      printf(" %11.5g %11.5g %11.5g",p->polarisation[0],p->polarisation[1],p->polarisation[2]);
    if (has_uf)
      printf(" 0x%08x",p->userflags);
    printf("\n");
  }
}